

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptor::DebugString
          (EnumValueDescriptor *this,int depth,string *contents,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  int value;
  string *value_00;
  EnumValueOptions *options;
  EnumDescriptor *this_00;
  FileDescriptor *this_01;
  DescriptorPool *pool;
  SubstituteArg local_4d8;
  SubstituteArg local_4a8;
  SubstituteArg local_478;
  SubstituteArg local_448;
  SubstituteArg local_418;
  SubstituteArg local_3e8;
  SubstituteArg local_3b8;
  SubstituteArg local_388;
  SubstituteArg local_358;
  SubstituteArg local_328;
  undefined1 local_2f8 [8];
  string formatted_options;
  SubstituteArg local_2a8;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  SubstituteArg local_128;
  undefined1 local_f8 [8];
  SourceLocationCommentPrinter comment_printer;
  allocator local_49;
  undefined1 local_48 [8];
  string prefix;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  int depth_local;
  EnumValueDescriptor *this_local;
  
  prefix.field_2._8_8_ = debug_string_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,(long)(depth * 2),' ',&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::EnumValueDescriptor>
            ((SourceLocationCommentPrinter *)local_f8,this,(string *)local_48,
             (DebugStringOptions *)prefix.field_2._8_8_);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  strings::internal::SubstituteArg::SubstituteArg(&local_128,(string *)local_48);
  value_00 = name_abi_cxx11_(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_158,value_00);
  value = number(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_188,value);
  strings::internal::SubstituteArg::SubstituteArg(&local_1b8);
  strings::internal::SubstituteArg::SubstituteArg(&local_1e8);
  strings::internal::SubstituteArg::SubstituteArg(&local_218);
  strings::internal::SubstituteArg::SubstituteArg(&local_248);
  strings::internal::SubstituteArg::SubstituteArg(&local_278);
  strings::internal::SubstituteArg::SubstituteArg(&local_2a8);
  strings::internal::SubstituteArg::SubstituteArg
            ((SubstituteArg *)((long)&formatted_options.field_2 + 8));
  strings::SubstituteAndAppend
            (contents,"$0$1 = $2",&local_128,&local_158,&local_188,&local_1b8,&local_1e8,&local_218,
             &local_248,&local_278,&local_2a8,
             (SubstituteArg *)((long)&formatted_options.field_2 + 8));
  std::__cxx11::string::string((string *)local_2f8);
  options = EnumValueDescriptor::options(this);
  this_00 = type(this);
  this_01 = EnumDescriptor::file(this_00);
  pool = FileDescriptor::pool(this_01);
  bVar1 = anon_unknown_1::FormatBracketedOptions
                    (depth,&options->super_Message,pool,(string *)local_2f8);
  if (bVar1) {
    strings::internal::SubstituteArg::SubstituteArg(&local_328,(string *)local_2f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_358);
    strings::internal::SubstituteArg::SubstituteArg(&local_388);
    strings::internal::SubstituteArg::SubstituteArg(&local_3b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_3e8);
    strings::internal::SubstituteArg::SubstituteArg(&local_418);
    strings::internal::SubstituteArg::SubstituteArg(&local_448);
    strings::internal::SubstituteArg::SubstituteArg(&local_478);
    strings::internal::SubstituteArg::SubstituteArg(&local_4a8);
    strings::internal::SubstituteArg::SubstituteArg(&local_4d8);
    strings::SubstituteAndAppend
              (contents," [$0]",&local_328,&local_358,&local_388,&local_3b8,&local_3e8,&local_418,
               &local_448,&local_478,&local_4a8,&local_4d8);
  }
  std::__cxx11::string::append((char *)contents);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  std::__cxx11::string::~string((string *)local_2f8);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void EnumValueDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0$1 = $2", prefix, name(), number());

  std::string formatted_options;
  if (FormatBracketedOptions(depth, options(), type()->file()->pool(),
                             &formatted_options)) {
    strings::SubstituteAndAppend(contents, " [$0]", formatted_options);
  }
  contents->append(";\n");

  comment_printer.AddPostComment(contents);
}